

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_msg_internal_free2(void *m)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  undefined4 local_78 [2];
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined1 local_30;
  
  LOCK();
  plVar1 = (long *)((long)m + 0x30);
  *plVar1 = *plVar1 + -1;
  UNLOCK();
  if (*plVar1 == 0) {
    lVar3 = *(long *)((long)m + 0x40);
    if (lVar3 != 0) {
      do {
        lVar2 = lVar3 + -1;
        *(long *)((long)m + 0x40) = lVar2;
        if (*(long *)((long)m + lVar3 * 0x18 + 0x38) != 0) {
          local_78[0] = 0;
          local_60 = *(undefined8 *)((long)m + 0x10);
          local_70 = *m;
          uStack_68 = *(undefined8 *)((long)m + 8);
          local_48 = *(undefined8 *)((long)m + 0x28);
          local_58 = *(undefined8 *)((long)m + 0x18);
          uStack_50 = *(undefined8 *)((long)m + 0x20);
          local_40 = 0;
          uStack_38 = 0;
          local_30 = 0;
          (**(code **)((long)m + lVar2 * 0x18 + 0x50))
                    (local_78,*(undefined8 *)((long)m + lVar2 * 0x18 + 0x58));
        }
        lVar3 = *(long *)((long)m + 0x40);
      } while (lVar3 != 0);
    }
    fio_free(m);
  }
  return;
}

Assistant:

static inline void fio_msg_internal_free(fio_msg_internal_s *m) {
  if (fio_atomic_sub(&m->ref, 1))
    return;
  while (m->meta_len) {
    --m->meta_len;
    if (m->meta[m->meta_len].on_finish) {
      fio_msg_s tmp_msg = {
          .channel = m->channel,
          .msg = m->data,
      };
      m->meta[m->meta_len].on_finish(&tmp_msg, m->meta[m->meta_len].metadata);
    }
  }
  fio_free(m);
}